

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::SetAllValid
          (TemplatedValidityMask<unsigned_long> *this,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long lVar3;
  
  EnsureWritable(this);
  if (count != 0) {
    uVar2 = count + 0x3f >> 6;
    puVar1 = this->validity_mask;
    for (lVar3 = 0; uVar2 - 1 != lVar3; lVar3 = lVar3 + 1) {
      puVar1[lVar3] = 0xffffffffffffffff;
    }
    this->validity_mask[uVar2 - 1] =
         this->validity_mask[uVar2 - 1] |
         -(ulong)((count & 0x3f) == 0) | ~(-1L << ((byte)count & 0x3f));
  }
  return;
}

Assistant:

inline void SetAllValid(idx_t count) {
		EnsureWritable();
		if (count == 0) {
			return;
		}
		auto last_entry_index = ValidityBuffer::EntryCount(count) - 1;
		for (idx_t i = 0; i < last_entry_index; i++) {
			validity_mask[i] = ValidityBuffer::MAX_ENTRY;
		}
		auto last_entry_bits = count % BITS_PER_VALUE;
		validity_mask[last_entry_index] |= (last_entry_bits == 0)
		                                       ? ValidityBuffer::MAX_ENTRY
		                                       : ~static_cast<V>(ValidityBuffer::MAX_ENTRY << (last_entry_bits));
	}